

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int size_00;
  undefined4 extraout_var;
  LogMessage *pLVar1;
  LogFinisher local_79;
  string local_78;
  LogMessage local_58;
  ulong value;
  
  size_00 = (*this->_vptr_MessageLite[0xb])();
  value = CONCAT44(extraout_var,size_00);
  if ((value & 0xffffffff80000000) == 0) {
    if (value <= (ulong)(long)size) {
      SerializeToArrayImpl(this,(uint8 *)data,size_00);
      return true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message_lite.cc"
               ,0x1c7);
    (*this->_vptr_MessageLite[2])(&local_78,this);
    pLVar1 = internal::LogMessage::operator<<(&local_58,&local_78);
    pLVar1 = internal::LogMessage::operator<<(pLVar1," exceeded maximum protobuf size of 2GB: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,value);
    internal::LogFinisher::operator=(&local_79,pLVar1);
    std::__cxx11::string::~string((string *)&local_78);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return false;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < byte_size) return false;
  uint8* start = reinterpret_cast<uint8*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}